

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw_bwt.h
# Opt level: O0

void __thiscall bwtil::cw_bwt::computeEmpiricalEntropy(cw_bwt *this)

{
  reference pvVar1;
  ulong *in_RDI;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [64];
  undefined1 extraout_var [56];
  undefined1 auVar5 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar6 [16];
  undefined1 in_ZMM2 [64];
  double f;
  uint s;
  double H0;
  ulint i;
  double in_stack_ffffffffffffffb8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffc0;
  uint local_1c;
  double local_18;
  ulong local_10;
  
  in_RDI[0x27] = 0;
  for (local_10 = 0; local_10 < *in_RDI; local_10 = local_10 + 1) {
    pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x24),
                        local_10);
    local_18 = in_stack_ffffffffffffffb8;
    if (*pvVar1 != 0) {
      auVar4 = ZEXT1664((undefined1  [16])0x0);
      local_18 = 0.0;
      local_1c = 0;
      while( true ) {
        auVar3 = auVar4._0_16_;
        auVar6 = in_ZMM2._0_16_;
        auVar5 = in_ZMM1._0_16_;
        if ((uint)in_RDI[0x19] <= local_1c) break;
        std::
        vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      *)(in_RDI + 0x21),local_10);
        pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                           (in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8);
        auVar3 = vcvtusi2sd_avx512f(auVar3,*pvVar1);
        pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x24)
                            ,local_10);
        auVar5 = vcvtusi2sd_avx512f(auVar5,*pvVar1);
        dVar2 = auVar3._0_8_ / auVar5._0_8_;
        in_ZMM1 = ZEXT1664((undefined1  [16])0x0);
        if (0.0 < dVar2) {
          in_stack_ffffffffffffffc0 =
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)-dVar2;
          auVar4._0_8_ = log2(dVar2);
          auVar4._8_56_ = extraout_var;
          in_ZMM1 = ZEXT1664(auVar4._0_16_);
          dVar2 = (double)in_stack_ffffffffffffffc0 * auVar4._0_8_ + local_18;
          local_18 = dVar2;
        }
        auVar4 = ZEXT864((ulong)dVar2);
        local_1c = local_1c + 1;
      }
      pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x24),
                          local_10);
      auVar3 = vcvtusi2sd_avx512f(auVar5,*pvVar1);
      auVar5 = vcvtusi2sd_avx512f(auVar6,in_RDI[3]);
      in_ZMM2 = ZEXT1664(auVar5);
      dVar2 = auVar3._0_8_ / auVar5._0_8_;
      in_ZMM1 = ZEXT1664(CONCAT88(auVar3._8_8_,dVar2));
      in_RDI[0x27] = (ulong)(local_18 * dVar2 + (double)in_RDI[0x27]);
    }
    in_stack_ffffffffffffffb8 = local_18;
  }
  return;
}

Assistant:

void computeEmpiricalEntropy(){

		//warning:to be called AFTER initialization of structures

		Hk = 0;//k-order empirical entropy

		for(ulint i=0;i<number_of_contexts;i++){//for each non-empty context

			if(lengths[i]>0){

				double H0=0;//0-order entropy of this context

				for(uint s=0;s<sigma;s++){//for each symbol in the alphabet

					double f = (double)frequencies[i].at(s)/(double)lengths[i];

					if(f>0)
						H0 += -f*log2(f);

				}

				Hk += H0*((double)lengths[i]/(double)n);

			}
		}

	}